

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

void mi_free_block_delayed_mt(mi_page_t *page,mi_block_t *block)

{
  void *null;
  mi_delayed_t mVar1;
  mi_page_t *pmVar2;
  mi_block_t *pmVar3;
  mi_thread_free_t mVar4;
  mi_block_t *in_RSI;
  long in_RDI;
  bool bVar5;
  mi_block_t *dfree;
  mi_heap_t *heap;
  mi_thread_free_t tfree;
  _Bool use_delayed;
  mi_thread_free_t tfreex;
  undefined4 in_stack_ffffffffffffff38;
  mi_delayed_t in_stack_ffffffffffffff3c;
  mi_page_t *in_stack_ffffffffffffff40;
  mi_block_t *local_58;
  mi_page_t *local_28;
  mi_thread_free_t local_18;
  
  local_28 = (mi_page_t *)*(mi_thread_free_t *)(in_RDI + 0x38);
  do {
    mVar1 = mi_tf_delayed((mi_thread_free_t)local_28);
    if (mVar1 == MI_USE_DELAYED_FREE) {
      local_18 = mi_tf_set_delayed((mi_thread_free_t)in_stack_ffffffffffffff40,
                                   in_stack_ffffffffffffff3c);
    }
    else {
      mi_tf_block((mi_thread_free_t)local_28);
      mi_block_set_next(in_stack_ffffffffffffff40,
                        (mi_block_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (mi_block_t *)0xac2364);
      local_18 = mi_tf_set_block((mi_thread_free_t)in_stack_ffffffffffffff40,
                                 (mi_block_t *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    LOCK();
    pmVar2 = *(mi_page_t **)(in_RDI + 0x38);
    bVar5 = local_28 == pmVar2;
    if (bVar5) {
      *(mi_thread_free_t *)(in_RDI + 0x38) = local_18;
      pmVar2 = local_28;
    }
    UNLOCK();
    local_28 = pmVar2;
  } while (!bVar5);
  if (mVar1 == MI_USE_DELAYED_FREE) {
    null = *(void **)(in_RDI + 0x40);
    if (null != (void *)0x0) {
      local_58 = *(mi_block_t **)((long)null + 8);
      do {
        mi_block_set_nextx(null,in_RSI,local_58,(uintptr_t *)((long)null + 0x28));
        LOCK();
        pmVar3 = *(mi_block_t **)((long)null + 8);
        bVar5 = local_58 == pmVar3;
        if (bVar5) {
          *(mi_block_t **)((long)null + 8) = in_RSI;
          pmVar3 = local_58;
        }
        UNLOCK();
        local_58 = pmVar3;
      } while (!bVar5);
    }
    local_28 = *(mi_page_t **)(in_RDI + 0x38);
    do {
      mVar4 = mi_tf_set_delayed((mi_thread_free_t)in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff3c);
      LOCK();
      in_stack_ffffffffffffff40 = *(mi_page_t **)(in_RDI + 0x38);
      bVar5 = local_28 == in_stack_ffffffffffffff40;
      if (bVar5) {
        *(mi_thread_free_t *)(in_RDI + 0x38) = mVar4;
        in_stack_ffffffffffffff40 = local_28;
      }
      UNLOCK();
      in_stack_ffffffffffffff3c = CONCAT13(bVar5,(int3)in_stack_ffffffffffffff3c);
      local_28 = in_stack_ffffffffffffff40;
    } while (!bVar5);
  }
  return;
}

Assistant:

static void mi_decl_noinline mi_free_block_delayed_mt( mi_page_t* page, mi_block_t* block )
{
  // Try to put the block on either the page-local thread free list,
  // or the heap delayed free list (if this is the first non-local free in that page)
  mi_thread_free_t tfreex;
  bool use_delayed;
  mi_thread_free_t tfree = mi_atomic_load_relaxed(&page->xthread_free);
  do {
    use_delayed = (mi_tf_delayed(tfree) == MI_USE_DELAYED_FREE);
    if mi_unlikely(use_delayed) {
      // unlikely: this only happens on the first concurrent free in a page that is in the full list
      tfreex = mi_tf_set_delayed(tfree,MI_DELAYED_FREEING);
    }
    else {
      // usual: directly add to page thread_free list
      mi_block_set_next(page, block, mi_tf_block(tfree));
      tfreex = mi_tf_set_block(tfree,block);
    }
  } while (!mi_atomic_cas_weak_release(&page->xthread_free, &tfree, tfreex));

  // If this was the first non-local free, we need to push it on the heap delayed free list instead
  if mi_unlikely(use_delayed) {
    // racy read on `heap`, but ok because MI_DELAYED_FREEING is set (see `mi_heap_delete` and `mi_heap_collect_abandon`)
    mi_heap_t* const heap = (mi_heap_t*)(mi_atomic_load_acquire(&page->xheap)); //mi_page_heap(page);
    mi_assert_internal(heap != NULL);
    if (heap != NULL) {
      // add to the delayed free list of this heap. (do this atomically as the lock only protects heap memory validity)
      mi_block_t* dfree = mi_atomic_load_ptr_relaxed(mi_block_t, &heap->thread_delayed_free);
      do {
        mi_block_set_nextx(heap,block,dfree, heap->keys);
      } while (!mi_atomic_cas_ptr_weak_release(mi_block_t,&heap->thread_delayed_free, &dfree, block));
    }

    // and reset the MI_DELAYED_FREEING flag
    tfree = mi_atomic_load_relaxed(&page->xthread_free);
    do {
      tfreex = tfree;
      mi_assert_internal(mi_tf_delayed(tfree) == MI_DELAYED_FREEING);
      tfreex = mi_tf_set_delayed(tfree,MI_NO_DELAYED_FREE);
    } while (!mi_atomic_cas_weak_release(&page->xthread_free, &tfree, tfreex));
  }
}